

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O0

void __thiscall mjs::gc_heap::pointer_set::erase(pointer_set *this,gc_heap_ptr_untyped *p)

{
  uint uVar1;
  uint uVar2;
  uint local_1c;
  uint32_t i;
  gc_heap_ptr_untyped *p_local;
  pointer_set *this_local;
  
  local_1c = this->size_;
  do {
    uVar2 = local_1c - 1;
    if (local_1c == 0) {
      __assert_fail("!\"Pointer not found in set!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h"
                    ,0x10a,"void mjs::gc_heap::pointer_set::erase(const gc_heap_ptr_untyped &)");
    }
    local_1c = uVar2;
  } while (this->set_[uVar2] != p);
  uVar1 = this->size_ - 1;
  this->size_ = uVar1;
  std::swap<mjs::gc_heap_ptr_untyped*>(this->set_ + uVar2,this->set_ + uVar1);
  return;
}

Assistant:

void erase(const gc_heap_ptr_untyped& p) {
            // Search from the back since objects tend to be short lived
            for (uint32_t i = size_; i--;) {
                if (set_[i] == &p) {
                    std::swap(set_[i], set_[--size_]);
                    return;
                }
            }
            assert(!"Pointer not found in set!");
        }